

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::setup_tightenBound(HModel *this)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int k;
  uint uVar11;
  int i;
  long lVar12;
  int i_1;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int k_1;
  long lVar18;
  uint uVar19;
  bool bVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> iwork;
  vector<double,_std::allocator<double>_> colLower0;
  vector<double,_std::allocator<double>_> colUpper0;
  
  if (this->intOption[3] != 0) {
    ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&iwork,(long)this->numRow,(value_type *)&ARstart,(allocator_type *)&ARindex);
    ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&ARstart,(long)this->numRow + 1,(value_type *)&ARindex,(allocator_type *)&ARvalue);
    uVar15 = (ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    iVar17 = (int)uVar15;
    std::vector<int,_std::allocator<int>_>::vector(&ARindex,(long)iVar17,(allocator_type *)&ARvalue)
    ;
    std::vector<double,_std::allocator<double>_>::vector
              (&ARvalue,(long)iVar17,(allocator_type *)&colLower0);
    piVar3 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    uVar15 = uVar15 & 0xffffffff;
    if (iVar17 < 1) {
      uVar15 = uVar14;
    }
    for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [piVar3[uVar14]] =
           iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[uVar14]] + 1;
    }
    for (lVar12 = 1; uVar15 = (ulong)this->numRow, lVar12 <= (long)uVar15; lVar12 = lVar12 + 1) {
      *(int *)(CONCAT44(ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + lVar12 * 4) =
           iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar12 + -1] +
           *(int *)(CONCAT44(ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + -4 + lVar12 * 4);
    }
    for (lVar12 = 0; lVar12 < (int)uVar15; lVar12 = lVar12 + 1) {
      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar12] = *(int *)(CONCAT44(ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_) + lVar12 * 4);
      uVar15 = (ulong)(uint)this->numRow;
    }
    piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    while (lVar18 = lVar12, lVar18 < this->numCol) {
      piVar4 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar16 = (long)piVar3[lVar18]; lVar12 = lVar18 + 1, lVar16 < piVar3[lVar18 + 1];
          lVar16 = lVar16 + 1) {
        iVar17 = piVar4[lVar16];
        iVar2 = iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar17];
        iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [iVar17] = iVar2 + 1;
        *(int *)(CONCAT44(ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)iVar2 * 4) = (int)lVar18;
        ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2] = pdVar5[lVar16];
      }
    }
    std::vector<double,_std::allocator<double>_>::vector(&colLower0,&this->colLower);
    std::vector<double,_std::allocator<double>_>::vector(&colUpper0,&this->colUpper);
    uVar10 = 0;
    uVar15 = (ulong)(uint)this->numRow;
    if (this->numRow < 1) {
      uVar15 = 0;
    }
    do {
      pdVar5 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = 0;
      for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
        dVar23 = pdVar5[uVar14];
        if ((-10000000000.0 <= dVar23) || (pdVar6[uVar14] <= 10000000000.0)) {
          lVar16 = (long)*(int *)(CONCAT44(ARstart.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                                           ARstart.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_) + 4 +
                                 uVar14 * 4);
          pdVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar25 = 0.0;
          dVar28 = 0.0;
          uVar13 = 0;
          uVar19 = 0;
          lVar18 = (long)*(int *)(CONCAT44(ARstart.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                                           ARstart.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                 uVar14 * 4);
          for (lVar12 = lVar18; lVar12 < lVar16; lVar12 = lVar12 + 1) {
            iVar2 = *(int *)(CONCAT44(ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) + lVar12 * 4);
            dVar31 = ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12];
            if (dVar31 <= 0.0) {
              dVar24 = -pdVar7[iVar2];
              dVar27 = -pdVar8[iVar2];
            }
            else {
              dVar24 = pdVar8[iVar2];
              dVar27 = pdVar7[iVar2];
            }
            uVar21 = -(ulong)(10000000000.0 <= dVar24);
            uVar22 = -(ulong)(dVar27 <= -10000000000.0);
            uVar19 = uVar19 - (int)uVar21;
            dVar25 = (double)((ulong)dVar25 & uVar21 |
                             ~uVar21 & (ulong)(ABS(dVar31) * dVar24 + dVar25));
            dVar28 = (double)((ulong)dVar28 & uVar22 |
                             ~uVar22 & (ulong)(ABS(dVar31) * dVar27 + dVar28));
            uVar13 = uVar13 - (int)uVar22;
          }
          dVar25 = ABS(dVar25) * 1e-08 + dVar25;
          dVar28 = ABS(dVar28) * -1e-08 + dVar28;
          auVar9._8_8_ = -(ulong)(100000000.0 < ABS(dVar28));
          auVar9._0_8_ = -(ulong)(100000000.0 < ABS(dVar25));
          uVar11 = movmskpd((int)lVar12,auVar9);
          dVar31 = 0.0;
          if ((uVar11 & 2) == 0) {
            dVar24 = 0.0;
          }
          else {
            dVar24 = ABS(dVar28) * 1e-12;
          }
          if ((uVar11 & 1) != 0) {
            dVar31 = ABS(dVar25) * 1e-12;
          }
          dVar27 = pdVar6[uVar14];
          if ((dVar27 + 1e-07 < (double)(int)uVar19 * 1e+31 + dVar25) ||
             ((double)(int)uVar13 * -1e+31 + dVar28 < dVar23 + -1e-07)) {
            for (; lVar18 < lVar16; lVar18 = lVar18 + 1) {
              dVar30 = ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
              iVar2 = *(int *)(CONCAT44(ARindex.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        ARindex.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar18 * 4
                              );
              dVar1 = pdVar7[iVar2];
              dVar26 = pdVar8[iVar2];
              dVar32 = (dVar23 - dVar25) / dVar30;
              if (dVar30 <= 0.0) {
                dVar32 = (double)(int)(1 - uVar19) * dVar1 + dVar32 + dVar31;
                if (uVar19 != 0) {
                  dVar32 = (double)((ulong)dVar32 & -(ulong)(dVar1 < -10000000000.0) |
                                   ~-(ulong)(dVar1 < -10000000000.0) & 0x6974e718d7d7625a);
                }
                if (1 < uVar19 || dVar23 <= -10000000000.0) {
                  dVar32 = 1e+200;
                }
                if (uVar13 != 0 && dVar26 <= 10000000000.0 ||
                    (1 < uVar13 || 10000000000.0 <= dVar27)) {
                  dVar29 = -1e+200;
                }
                else {
                  dVar29 = ((double)(int)(1 - uVar13) * dVar26 + (dVar27 - dVar28) / dVar30) -
                           dVar24;
                }
              }
              else {
                dVar29 = ((double)(int)(1 - uVar19) * dVar26 + dVar32) - dVar31;
                if (uVar19 != 0) {
                  dVar29 = (double)((ulong)dVar29 & -(ulong)(10000000000.0 < dVar26) |
                                   ~-(ulong)(10000000000.0 < dVar26) & 0xe974e718d7d7625a);
                }
                if (1 < uVar19 || dVar23 <= -10000000000.0) {
                  dVar29 = -1e+200;
                }
                if (uVar13 != 0 && -10000000000.0 <= dVar1 ||
                    (1 < uVar13 || 10000000000.0 <= dVar27)) {
                  dVar32 = 1e+200;
                }
                else {
                  dVar32 = (double)(int)(1 - uVar13) * dVar1 + (dVar27 - dVar28) / dVar30 + dVar24;
                }
              }
              if ((dVar32 < dVar26 + -1e-12) && (dVar32 < 10000000000.0)) {
                dVar30 = dVar1;
                if (dVar1 <= dVar32) {
                  dVar30 = dVar32;
                }
                pdVar8[iVar2] = dVar30;
                iVar17 = iVar17 + 1;
              }
              if ((dVar1 + 1e-12 < dVar29) && (-10000000000.0 < dVar29)) {
                if (dVar29 <= dVar26) {
                  dVar26 = dVar29;
                }
                pdVar7[iVar2] = dVar26;
                iVar17 = iVar17 + 1;
              }
            }
          }
        }
      }
    } while ((iVar17 != 0) && (bVar20 = uVar10 < 10, uVar10 = (iVar17 != 0) + uVar10, bVar20));
    pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    uVar15 = (ulong)(uint)this->numCol;
    if (this->numCol < 1) {
      uVar15 = uVar14;
    }
    for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      dVar23 = colUpper0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      dVar25 = colLower0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      if (dVar25 + 0.001 < dVar23) {
        dVar28 = pdVar5[uVar14];
        dVar31 = pdVar6[uVar14];
        if (0.00100001 <= dVar28 - dVar31) {
          if (dVar28 < dVar23) {
            if (dVar28 + 0.1 <= dVar23) {
              dVar23 = dVar28 + 0.1;
            }
            pdVar5[uVar14] = dVar23;
            dVar31 = pdVar6[uVar14];
            dVar25 = colLower0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
          }
          if (dVar25 < dVar31) {
            if (dVar31 + -0.1 <= dVar25) {
              dVar25 = dVar31 + -0.1;
            }
            pdVar6[uVar14] = dVar25;
          }
        }
        else {
          dVar23 = dVar31 + -0.1;
          if (dVar31 + -0.1 <= dVar25) {
            dVar23 = dVar25;
          }
          pdVar6[uVar14] = dVar23;
          dVar23 = pdVar5[uVar14] + 0.1;
          if (colUpper0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] <= pdVar5[uVar14] + 0.1) {
            dVar23 = colUpper0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
          }
          pdVar5[uVar14] = dVar23;
        }
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&colUpper0.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&colLower0.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ARvalue.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ARindex.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ARstart.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&iwork.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void HModel::setup_tightenBound() {
    if (intOption[INTOPT_TIGHT_FLAG] == 0)
        return;

    // Make a AR copy
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Save column bounds
    vector<double> colLower0 = colLower;
    vector<double> colUpper0 = colUpper;

    double big_B = 1e10;
    int iPass = 0;
    for (;;) {
        int numberChanged = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            // SKIP free rows
            if (rowLower[iRow] < -big_B && rowUpper[iRow] > big_B)
                continue;

            // possible row
            int ninfU = 0;
            int ninfL = 0;
            double xmaxU = 0.0;
            double xminL = 0.0;
            int myStart = ARstart[iRow];
            int myEnd = ARstart[iRow + 1];
            // Compute possible lower and upper ranges

            for (int k = myStart; k < myEnd; ++k) {
                int iCol = ARindex[k];
                double value = ARvalue[k];
                double upper = value > 0 ? colUpper[iCol] : -colLower[iCol];
                double lower = value > 0 ? colLower[iCol] : -colUpper[iCol];
                value = fabs(value);
                if (upper < big_B)
                    xmaxU += upper * value;
                else
                    ++ninfU;
                if (lower > -big_B)
                    xminL += lower * value;
                else
                    ++ninfL;
            }

            // Build in a margin of error
            xmaxU += 1.0e-8 * fabs(xmaxU);
            xminL -= 1.0e-8 * fabs(xminL);

            double xminLmargin =
                    (fabs(xminL) > 1.0e8) ? 1e-12 * fabs(xminL) : 0;
            double xmaxUmargin =
                    (fabs(xmaxU) > 1.0e8) ? 1e-12 * fabs(xmaxU) : 0;

            // Skip redundant row : also need to consider U < L  case
            double comp_U = xmaxU + ninfU * 1.0e31;
            double comp_L = xminL - ninfL * 1.0e31;
            if (comp_U <= rowUpper[iRow] + 1e-7
                    && comp_L >= rowLower[iRow] - 1e-7)
                continue;

            double row_L = rowLower[iRow];
            double row_U = rowUpper[iRow];

            // Now see if we can tighten column bounds
            for (int k = myStart; k < myEnd; ++k) {
                double value = ARvalue[k];
                int iCol = ARindex[k];
                double col_L = colLower[iCol];
                double col_U = colUpper[iCol];
                double new_L = -HSOL_CONST_INF;
                double new_U = +HSOL_CONST_INF;

                if (value > 0.0) {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_U > +big_B))
                        new_L = (row_L - xmaxU) / value + (1 - ninfU) * col_U
                                - xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_L < -big_B))
                        new_U = (row_U - xminL) / value + (1 - ninfL) * col_L
                                + xminLmargin;
                } else {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_L < -big_B))
                        new_U = (row_L - xmaxU) / value + (1 - ninfU) * col_L
                                + xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_U > +big_B))
                        new_L = (row_U - xminL) / value + (1 - ninfL) * col_U
                                - xminLmargin;
                }

                if (new_U < col_U - 1.0e-12 && new_U < big_B) {
                    colUpper[iCol] = max(new_U, col_L);
                    numberChanged++;
                }
                if (new_L > col_L + 1.0e-12 && new_L > -big_B) {
                    colLower[iCol] = min(new_L, col_U);
                    numberChanged++;
                }
            }
        }

        if (numberChanged == 0)
            break;
        iPass++;
        if (iPass > 10)
            break;

    }

    double useTolerance = 1.0e-3;
    for (int iCol = 0; iCol < numCol; iCol++) {
        if (colUpper0[iCol] > colLower0[iCol] + useTolerance) {
            const double relax = 100.0 * useTolerance;
            if (colUpper[iCol] - colLower[iCol] < useTolerance + 1.0e-8) {
                colLower[iCol] = max(colLower0[iCol], colLower[iCol] - relax);
                colUpper[iCol] = min(colUpper0[iCol], colUpper[iCol] + relax);
            } else {
                if (colUpper[iCol] < colUpper0[iCol]) {
                    colUpper[iCol] = min(colUpper[iCol] + relax,
                            colUpper0[iCol]);
                }
                if (colLower[iCol] > colLower0[iCol]) {
                    colLower[iCol] = min(colLower[iCol] - relax,
                            colLower0[iCol]);
                }
            }
        }
    }
}